

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O1

int mwTestBuf(mwData *mw,char *file,int line)

{
  uchar *puVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint len;
  uchar *ptr;
  mwData *pmVar6;
  void *p;
  char *file_00;
  bool bVar7;
  
  file_00 = "unknown";
  if (file != (char *)0x0) {
    file_00 = file;
  }
  len = 8;
  if (mwDataSize != '\0') {
    len = 0x40;
  }
  iVar3 = mwIsSafeAddr(mw,len);
  if (iVar3 == 0) {
    mwWrite("internal: <%ld> %s(%d): pointer MW-%p is invalid\n",mwCounter,file_00,(ulong)(uint)line
            ,mw);
    iVar3 = 2;
  }
  else {
    if ((mw->count ^ mw->check ^ mw->size ^ (long)mw->line) != 0xfe0180) {
      mwWrite("internal: <%ld> %s(%d), info trashed; relinking\n",mwCounter,file_00,
              (ulong)(uint)line);
      mwErrors = mwErrors + 1;
      iVar3 = mwFlushR();
      mwFlushingB2 = iVar3 + 1;
      mwFlushingB1 = mwFlushingB2;
      mwFlushing = mwFlushingB2;
      mwFlush();
      iVar3 = mwRelink(mw,file_00,line);
      if (iVar3 == 0) {
        return 2;
      }
    }
    iVar3 = 0;
    if ((mw->prev != (mwData *)0x0) && (iVar3 = 0, mw->prev->next != mw)) {
      mwWrite("internal: <%ld> %s(%d), buffer <%ld> %s(%d) link1 broken\n",mwCounter,file_00,
              (ulong)(uint)line,mw->size,mw->count,mw->file,(ulong)(uint)mw->line);
      mwErrors = mwErrors + 1;
      iVar3 = mwFlushR();
      mwFlushingB2 = iVar3 + 1;
      mwFlushingB1 = mwFlushingB2;
      mwFlushing = mwFlushingB2;
      mwFlush();
      iVar3 = mwRelink(mw,file_00,line);
      iVar3 = (uint)(iVar3 == 0) * 2;
    }
    if ((mw->next != (mwData *)0x0) && (mw->next->prev != mw)) {
      mwWrite("internal: <%ld> %s(%d), buffer <%ld> %s(%d) link2 broken\n",mwCounter,file_00,
              (ulong)(uint)line,mw->size,mw->count,mw->file,(ulong)(uint)mw->line);
      mwErrors = mwErrors + 1;
      iVar4 = mwFlushR();
      mwFlushingB2 = iVar4 + 1;
      mwFlushingB1 = mwFlushingB2;
      mwFlushing = mwFlushingB2;
      mwFlush();
      iVar4 = mwRelink(mw,file_00,line);
      if (iVar4 == 0) {
        iVar3 = 2;
      }
    }
    pmVar6 = mw + 1;
    if (mwDataSize == '\0') {
      pmVar6 = mw;
    }
    lVar5 = 0;
    do {
      uVar2 = *(uchar *)((long)&pmVar6->prev + lVar5);
      puVar1 = "mEmwAtch" + lVar5;
      if (uVar2 != *puVar1) break;
      bVar7 = lVar5 != 7;
      lVar5 = lVar5 + 1;
    } while (bVar7);
    if (uVar2 != *puVar1) {
      mwWrite("underflow: <%ld> %s(%d), %ld bytes alloc\'d at <%ld> %s(%d)\n",mwCounter,file_00,
              (ulong)(uint)line,mw->size,mw->count,mw->file,(ulong)(uint)mw->line);
      mwErrors = mwErrors + 1;
      iVar3 = mwFlushR();
      mwFlushingB2 = iVar3 + 1;
      mwFlushingB1 = mwFlushingB2;
      mwFlushing = mwFlushingB2;
      mwFlush();
      iVar3 = 1;
    }
    p = (void *)((long)&pmVar6->next + mw->size);
    iVar4 = mwIsReadAddr(p,8);
    if (iVar4 == 0) {
      return iVar3;
    }
    lVar5 = 0;
    do {
      uVar2 = *(uchar *)((long)p + lVar5);
      puVar1 = "mEmwAtch" + lVar5;
      if (uVar2 != *puVar1) break;
      bVar7 = lVar5 != 7;
      lVar5 = lVar5 + 1;
    } while (bVar7);
    if (uVar2 == *puVar1) {
      return iVar3;
    }
    mwWrite("overflow: <%ld> %s(%d), %ld bytes alloc\'d at <%ld> %s(%d)\n",mwCounter,file_00,
            (ulong)(uint)line,mw->size,mw->count,mw->file,(ulong)(uint)mw->line);
    iVar3 = 1;
  }
  mwErrors = mwErrors + 1;
  iVar4 = mwFlushR();
  mwFlushingB2 = iVar4 + 1;
  mwFlushingB1 = mwFlushingB2;
  mwFlushing = mwFlushingB2;
  mwFlush();
  return iVar3;
}

Assistant:

static int mwTestBuf(mwData *mw, const char *file, int line)
{
	int retv = 0;
	char *p;

	if (file == NULL) {
		file = "unknown";
	}

	if (!mwIsSafeAddr(mw, mwDataSize + mwOverflowZoneSize)) {
		mwWrite("internal: <%ld> %s(%d): pointer MW-%p is invalid\n",
				mwCounter, file, line, mw);
		mwIncErr();
		return 2;
	}

	if (mw->check != CHKVAL(mw)) {
		mwWrite("internal: <%ld> %s(%d), info trashed; relinking\n",
				mwCounter, file, line);
		mwIncErr();
		if (!mwRelink(mw, file, line)) {
			return 2;
		}
	}

	if (mw->prev && mw->prev->next != mw) {
		mwWrite("internal: <%ld> %s(%d), buffer <%ld> %s(%d) link1 broken\n",
				mwCounter, file, line, (long)mw->size, mw->count, mw->file, mw->line);
		mwIncErr();
		if (!mwRelink(mw, file, line)) {
			retv = 2;
		}
	}
	if (mw->next && mw->next->prev != mw) {
		mwWrite("internal: <%ld> %s(%d), buffer <%ld> %s(%d) link2 broken\n",
				mwCounter, file, line, (long)mw->size, mw->count, mw->file, mw->line);
		mwIncErr();
		if (!mwRelink(mw, file, line)) {
			retv = 2;
		}
	}

	p = ((char *)mw) + mwDataSize;
	if (mwCheckOF(p)) {
		mwWrite("underflow: <%ld> %s(%d), %ld bytes alloc'd at <%ld> %s(%d)\n",
				mwCounter, file, line, (long)mw->size, mw->count, mw->file, mw->line);
		mwIncErr();
		retv = 1;
	}
	p += mwOverflowZoneSize + mw->size;
	if (mwIsReadAddr(p, mwOverflowZoneSize) && mwCheckOF(p)) {
		mwWrite("overflow: <%ld> %s(%d), %ld bytes alloc'd at <%ld> %s(%d)\n",
				mwCounter, file, line, (long)mw->size, mw->count, mw->file, mw->line);
		mwIncErr();
		retv = 1;
	}

	return retv;
}